

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpointer.c
# Opt level: O3

xmlXPathObjectPtr xmlXPtrNewLocationSetNodeSet(xmlNodeSetPtr set)

{
  xmlXPathObjectPtr pxVar1;
  xmlLocationSetPtr cur;
  xmlXPathObjectPtr val;
  long lVar2;
  
  pxVar1 = (xmlXPathObjectPtr)(*xmlMalloc)(0x48);
  if (pxVar1 != (xmlXPathObjectPtr)0x0) {
    *(undefined8 *)pxVar1 = 0;
    pxVar1->nodesetval = (xmlNodeSetPtr)0x0;
    *(undefined8 *)&pxVar1->index = 0;
    pxVar1->user2 = (void *)0x0;
    pxVar1->stringval = (xmlChar *)0x0;
    pxVar1->user = (void *)0x0;
    *(undefined8 *)&pxVar1->boolval = 0;
    pxVar1->floatval = 0.0;
    *(undefined8 *)&pxVar1->index2 = 0;
    pxVar1->type = XPATH_LOCATIONSET;
    if (set == (xmlNodeSetPtr)0x0) {
      return pxVar1;
    }
    cur = (xmlLocationSetPtr)(*xmlMalloc)(0x10);
    if (cur != (xmlLocationSetPtr)0x0) {
      cur->locNr = 0;
      cur->locMax = 0;
      cur->locTab = (xmlXPathObjectPtr *)0x0;
      if (0 < set->nodeNr) {
        lVar2 = 0;
        do {
          if (set->nodeTab[lVar2] == (xmlNodePtr)0x0) {
            val = (xmlXPathObjectPtr)0x0;
          }
          else {
            val = xmlXPtrNewRangeInternal(set->nodeTab[lVar2],-1,(xmlNodePtr)0x0,-1);
          }
          xmlXPtrLocationSetAdd(cur,val);
          lVar2 = lVar2 + 1;
        } while (lVar2 < set->nodeNr);
      }
      pxVar1->user = cur;
      return pxVar1;
    }
  }
  xmlXPtrErrMemory("allocating locationset");
  return pxVar1;
}

Assistant:

xmlXPathObjectPtr
xmlXPtrNewLocationSetNodeSet(xmlNodeSetPtr set) {
    xmlXPathObjectPtr ret;

    ret = (xmlXPathObjectPtr) xmlMalloc(sizeof(xmlXPathObject));
    if (ret == NULL) {
        xmlXPtrErrMemory("allocating locationset");
	return(NULL);
    }
    memset(ret, 0 , (size_t) sizeof(xmlXPathObject));
    ret->type = XPATH_LOCATIONSET;
    if (set != NULL) {
	int i;
	xmlLocationSetPtr newset;

	newset = xmlXPtrLocationSetCreate(NULL);
	if (newset == NULL)
	    return(ret);

	for (i = 0;i < set->nodeNr;i++)
	    xmlXPtrLocationSetAdd(newset,
		        xmlXPtrNewCollapsedRange(set->nodeTab[i]));

	ret->user = (void *) newset;
    }
    return(ret);
}